

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O0

bool __thiscall
duckdb::ThreadLocalLogger::ShouldLog(ThreadLocalLogger *this,char *log_type,LogLevel log_level)

{
  string *in_stack_ffffffffffffff98;
  NotImplementedException *this_00;
  allocator local_39;
  string local_38 [56];
  
  this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_38,"ThreadLocalLogger::ShouldLog",&local_39);
  NotImplementedException::NotImplementedException(this_00,in_stack_ffffffffffffff98);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,
              NotImplementedException::~NotImplementedException);
}

Assistant:

bool ThreadLocalLogger::ShouldLog(const char *log_type, LogLevel log_level) {
	throw NotImplementedException("ThreadLocalLogger::ShouldLog");
}